

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

idx_t duckdb::CalculateSliceLength<long>(idx_t begin,idx_t end,long step,bool svalid)

{
  idx_t iVar1;
  InvalidInputException *this;
  ulong uVar2;
  ulong uVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar3 = -step;
  if (0 < step) {
    uVar3 = step;
  }
  if (-1 < step) {
    uVar3 = step;
  }
  if (uVar3 == 0 && svalid) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Slice step cannot be zero","");
    duckdb::InvalidInputException::InvalidInputException(this,(string *)local_40);
    __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = end - begin;
  iVar1 = uVar2;
  if ((uVar3 != 1) && (iVar1 = 1, uVar3 < uVar2)) {
    iVar1 = (uVar2 / uVar3 + 1) - (ulong)(uVar2 % uVar3 == 0);
  }
  return iVar1;
}

Assistant:

static idx_t CalculateSliceLength(idx_t begin, idx_t end, INDEX_TYPE step, bool svalid) {
	if (step < 0) {
		step = AbsValue(step);
	}
	if (step == 0 && svalid) {
		throw InvalidInputException("Slice step cannot be zero");
	}
	if (step == 1) {
		return NumericCast<idx_t>(end - begin);
	} else if (static_cast<idx_t>(step) >= (end - begin)) {
		return 1;
	}
	if ((end - begin) % UnsafeNumericCast<idx_t>(step) != 0) {
		return (end - begin) / UnsafeNumericCast<idx_t>(step) + 1;
	}
	return (end - begin) / UnsafeNumericCast<idx_t>(step);
}